

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

Cba_Ntk_t *
Cba_NtkDupOrder(Cba_Man_t *pMan,Cba_Ntk_t *p,_func_Vec_Int_t_ptr_Cba_Ntk_t_ptr *pFuncOrder)

{
  Vec_Int_t *local_40;
  Vec_Int_t *vObjs;
  Cba_Ntk_t *pNew;
  _func_Vec_Int_t_ptr_Cba_Ntk_t_ptr *pFuncOrder_local;
  Cba_Ntk_t *p_local;
  Cba_Man_t *pMan_local;
  
  if (pFuncOrder == (_func_Vec_Int_t_ptr_Cba_Ntk_t_ptr *)0x0) {
    local_40 = Cba_NtkCollect(p);
  }
  else {
    local_40 = (*pFuncOrder)(p);
  }
  if (local_40 == (Vec_Int_t *)0x0) {
    pMan_local = (Cba_Man_t *)0x0;
  }
  else {
    pMan_local = (Cba_Man_t *)Cba_NtkDup(pMan,p,local_40);
    Vec_IntFree(local_40);
  }
  return (Cba_Ntk_t *)pMan_local;
}

Assistant:

static inline Cba_Ntk_t * Cba_NtkDupOrder( Cba_Man_t * pMan, Cba_Ntk_t * p, Vec_Int_t*(* pFuncOrder)(Cba_Ntk_t*) )
{
    Cba_Ntk_t * pNew;
    Vec_Int_t * vObjs = pFuncOrder ? pFuncOrder(p) : Cba_NtkCollect(p);
    if ( vObjs == NULL )
        return NULL;
    pNew = Cba_NtkDup( pMan, p, vObjs );
    Vec_IntFree( vObjs );
    //Cba_NtkPrepareSeq( pNew );
    return pNew;
}